

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O1

bool __thiscall MT32Emu::Partial::canProduceOutput(Partial *this)

{
  bool bVar1;
  
  if (((this->ownerPart < 0) || (this->alreadyOutputed != false)) ||
     ((this->pair != (Partial *)0x0 && ((this->structurePosition == 1 && (this->mixType - 1U < 2))))
     )) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (this->poly == (Poly *)0x0) {
      bVar1 = false;
      Synth::printDebug(this->synth,
                        "[Partial %d] *** ERROR: poly is NULL at Partial::produceOutput()!",
                        (ulong)(uint)this->partialIndex);
    }
  }
  return bVar1;
}

Assistant:

bool Partial::isActive() const {
	return ownerPart > -1;
}